

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
cs::compiler_type::kill_expr
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens)

{
  int iVar1;
  token_base *ptVar2;
  undefined4 extraout_var;
  tree_type<cs::token_base_*> *tree_00;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *this_00;
  value_type *__x;
  value_type *pptVar3;
  tree_type<cs::token_base_*> tree;
  _Map_pointer local_f8;
  tree_type<cs::token_base_*> local_f0;
  _func_int **local_e8;
  compiler_type *local_e0;
  token_base *local_d8;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> expr;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> oldt;
  
  local_e0 = this;
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_Deque_base
            (&oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_Deque_base
            (&expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
  std::swap<std::_Deque_base<cs::token_base*,std::allocator<cs::token_base*>>::_Deque_impl_data>
            ((_Deque_impl_data *)tokens,(_Deque_impl_data *)&oldt);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear(tokens);
  local_f8 = oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  local_e8 = (_func_int **)&PTR__token_expr_0023d118;
  __x = oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur;
  pptVar3 = oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  do {
    if (__x == oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur) {
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                (&expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                (&oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
      return;
    }
    iVar1 = (*(*__x)->_vptr_token_base[2])();
    if (iVar1 == 2) {
LAB_00175aa1:
      this_00 = &tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>;
      if (expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur !=
          expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur) {
        tree.mRoot = (tree_node *)0x0;
        tree_00 = &tree;
        gen_tree(local_e0,tree_00,
                 (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 &expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
        ptVar2 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)tree_00);
        iVar1 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)tree.mRoot,(EVP_PKEY_CTX *)0x0);
        ptVar2->line_num = 1;
        ptVar2->_vptr_token_base = local_e8;
        ptVar2[1]._vptr_token_base = (_func_int **)CONCAT44(extraout_var,iVar1);
        local_f0.mRoot = (tree_node *)0x0;
        local_d8 = ptVar2;
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::emplace_back<cs::token_base*>
                  ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,&local_d8);
        tree_type<cs::token_base_*>::~tree_type(&local_f0);
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   &expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
        tree_type<cs::token_base_*>::~tree_type(&tree);
      }
    }
    else {
      iVar1 = (*(*__x)->_vptr_token_base[2])();
      this_00 = &expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>;
      if (iVar1 == 1) goto LAB_00175aa1;
    }
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)this_00,__x);
    __x = __x + 1;
    if (__x == pptVar3) {
      __x = local_f8[1];
      local_f8 = local_f8 + 1;
      pptVar3 = __x + 0x40;
    }
  } while( true );
}

Assistant:

void compiler_type::kill_expr(std::deque<token_base *> &tokens)
	{
		std::deque<token_base *> oldt, expr;
		std::swap(tokens, oldt);
		tokens.clear();
		for (auto &ptr: oldt) {
			if (ptr->get_type() == token_types::action || ptr->get_type() == token_types::endline) {
				if (!expr.empty()) {
					tree_type<token_base *> tree;
					gen_tree(tree, expr);
					tokens.push_back(new token_expr(tree));
					expr.clear();
				}
				tokens.push_back(ptr);
			}
			else
				expr.push_back(ptr);
		}
	}